

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

void CreateDefaultClassConstructor
               (ExpressionContext *ctx,SynBase *source,ExprClassDefinition *classDefinition)

{
  uint uVar1;
  TypeClass *classType;
  ScopeData *pSVar2;
  Allocator *allocator;
  ExprBase **ppEVar3;
  FunctionData **ppFVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  TypeBase *pTVar8;
  long lVar9;
  undefined4 extraout_var;
  FunctionData *this;
  TypeFunction *pTVar10;
  TypeRef *contextType;
  SynBase *pSVar11;
  ExprVariableDefinition *pEVar12;
  ExprBase *pEVar13;
  _func_int **pp_Var14;
  VariableData *context;
  ExprVariableDefinition *pEVar15;
  undefined4 extraout_var_03;
  bool bVar16;
  char *pcVar17;
  TypeBase *pTVar18;
  MemberHandle *pMVar19;
  InplaceStr IVar20;
  ArrayView<ArgumentData> arguments_00;
  IntrusiveList<ExprBase> expressions;
  SmallArray<ArgumentData,_32U> arguments;
  IntrusiveList<ExprBase> local_678;
  undefined8 local_668;
  undefined8 uStack_660;
  ExprBase *local_658;
  ExprBase *pEStack_650;
  SmallArray<ArgumentData,_32U> local_648;
  SynIdentifier *name;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  classType = classDefinition->classType;
  if (classType->extendable == false) {
    pMVar19 = (classType->super_TypeStruct).members.head;
    if (pMVar19 == (MemberHandle *)0x0) {
      return;
    }
    bVar6 = false;
    do {
      pTVar18 = pMVar19->variable->type;
      while( true ) {
        if ((pTVar18 == (TypeBase *)0x0) || (pTVar8 = pTVar18, pTVar18->typeID != 0x13)) {
          pTVar8 = (TypeBase *)0x0;
        }
        if (pTVar8 == (TypeBase *)0x0) break;
        pTVar18 = (TypeBase *)pTVar8[1]._vptr_TypeBase;
      }
      if (pMVar19->initializer == (SynBase *)0x0) {
        bVar5 = HasDefaultConstructor(ctx,source,pTVar18);
        bVar16 = !bVar5;
        if (bVar5) {
          bVar6 = true;
        }
      }
      else {
        bVar6 = true;
        bVar16 = false;
      }
    } while ((bVar16) && (pMVar19 = pMVar19->next, pMVar19 != (MemberHandle *)0x0));
    if (!bVar6) {
      return;
    }
  }
  bVar6 = RestoreParentTypeScope(ctx,source,(TypeBase *)classType);
  pSVar2 = ctx->scope;
  IVar20 = GetTypeDefaultConstructorName(ctx,classType);
  IVar20 = GetFunctionNameInScope(ctx,pSVar2,(TypeBase *)classType,IVar20,false,false);
  local_648.allocator = ctx->allocator;
  lVar9 = 0x20;
  do {
    *(undefined8 *)((long)&local_658 + lVar9) = 0;
    *(undefined1 *)((long)&pEStack_650 + lVar9) = 0;
    *(undefined8 *)((long)local_648.little + lVar9 + -0x10) = 0;
    *(undefined8 *)((long)local_648.little + lVar9 + -8) = 0;
    *(undefined8 *)((long)&local_648.little[0].source + lVar9) = 0;
    *(undefined8 *)(&local_648.little[0].isExplicit + lVar9) = 0;
    lVar9 = lVar9 + 0x30;
  } while (lVar9 != 0x620);
  local_648.data = local_648.little;
  local_648.count = 0;
  local_648.max = 0x20;
  iVar7 = (*(local_648.allocator)->_vptr_Allocator[2])(local_648.allocator,0x50);
  name = (SynIdentifier *)CONCAT44(extraout_var,iVar7);
  (name->super_SynBase).typeID = 4;
  (name->super_SynBase).begin = (Lexeme *)0x0;
  (name->super_SynBase).end = (Lexeme *)0x0;
  (name->super_SynBase).pos.begin = (char *)0x0;
  (name->super_SynBase).pos.end = (char *)0x0;
  *(undefined8 *)((long)&(name->super_SynBase).pos.end + 2) = 0;
  *(undefined8 *)((long)&(name->super_SynBase).next + 2) = 0;
  (name->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f6178;
  name->name = IVar20;
  iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x338);
  this = (FunctionData *)CONCAT44(extraout_var_00,iVar7);
  allocator = ctx->allocator;
  pSVar2 = ctx->scope;
  arguments_00.count = local_648.count;
  arguments_00.data = local_648.data;
  arguments_00._12_4_ = 0;
  pTVar10 = ExpressionContext::GetFunctionType(ctx,source,ctx->typeVoid,arguments_00);
  contextType = ExpressionContext::GetReferenceType(ctx,(TypeBase *)classType);
  local_668 = 0;
  uStack_660 = 0;
  uVar1 = ctx->uniqueFunctionId;
  ctx->uniqueFunctionId = uVar1 + 1;
  pcVar17 = (char *)0x0;
  FunctionData::FunctionData
            (this,allocator,source,pSVar2,false,false,false,pTVar10,&contextType->super_TypeBase,
             name,(IntrusiveList<MatchData>)ZEXT816(0),uVar1);
  IVar20.end = pcVar17;
  IVar20.begin = (this->name->name).end;
  anon_unknown.dwarf_11255e::CheckFunctionConflict
            ((anon_unknown_dwarf_11255e *)ctx,(ExpressionContext *)source,
             (SynBase *)(this->name->name).begin,IVar20);
  ExpressionContext::AddFunction(ctx,this);
  ExpressionContext::PushScope(ctx,this);
  this->functionScope = ctx->scope;
  pSVar11 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
  pEVar12 = CreateFunctionContextArgument(ctx,pSVar11,this);
  this->argumentsSize = this->functionScope->dataSize;
  local_678.head = (ExprBase *)0x0;
  local_678.tail = (ExprBase *)0x0;
  CreateDefaultConstructorCode(ctx,source,classType,&local_678);
  iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
  pEVar13 = (ExprBase *)CONCAT44(extraout_var_01,iVar7);
  pTVar18 = ctx->typeVoid;
  iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
  pp_Var14 = (_func_int **)CONCAT44(extraout_var_02,iVar7);
  pTVar8 = ctx->typeVoid;
  *(undefined4 *)(pp_Var14 + 1) = 2;
  pp_Var14[2] = (_func_int *)source;
  pp_Var14[3] = (_func_int *)pTVar8;
  pp_Var14[4] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var14 + 5) = 0;
  *pp_Var14 = (_func_int *)&PTR__ExprBase_003f6b40;
  pSVar11 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
  pSVar11 = (SynBase *)CreateFunctionUpvalueClose(ctx,pSVar11,this,ctx->scope);
  pEVar13->typeID = 0x1c;
  pEVar13->source = source;
  pEVar13->type = pTVar18;
  pEVar13->next = (ExprBase *)0x0;
  pEVar13->listed = false;
  pEVar13->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6670;
  pEVar13[1]._vptr_ExprBase = pp_Var14;
  *(undefined8 *)&pEVar13[1].typeID = 0;
  pEVar13[1].source = pSVar11;
  IntrusiveList<ExprBase>::push_back(&local_678,pEVar13);
  ClosePendingUpvalues(ctx,this);
  ExpressionContext::PopScope(ctx,SCOPE_FUNCTION,true);
  if (bVar6) {
    ExpressionContext::PopScope(ctx,SCOPE_TYPE,true);
  }
  context = CreateFunctionContextVariable(ctx,source,this,(FunctionData *)0x0);
  pEVar15 = CreateFunctionContextVariableDefinition(ctx,source,this,(FunctionData *)0x0,context);
  iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x78);
  pEVar13 = (ExprBase *)CONCAT44(extraout_var_03,iVar7);
  pTVar10 = this->type;
  local_658 = local_678.head;
  pEStack_650 = local_678.tail;
  pEVar13->typeID = 0x24;
  pEVar13->source = source;
  pEVar13->type = &pTVar10->super_TypeBase;
  pEVar13->next = (ExprBase *)0x0;
  pEVar13->listed = false;
  pEVar13->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f66a8;
  pEVar13[1]._vptr_ExprBase = (_func_int **)this;
  *(ExprVariableDefinition **)&pEVar13[1].typeID = pEVar12;
  pEVar13[1].source = (SynBase *)0x0;
  pEVar13[1].type = (TypeBase *)0x0;
  pEVar13[1].next = (ExprBase *)0x0;
  *(ExprBase **)&pEVar13[1].listed = local_678.head;
  pEVar13[2]._vptr_ExprBase = (_func_int **)local_678.tail;
  *(ExprVariableDefinition **)&pEVar13[2].typeID = pEVar15;
  pEVar13[2].source = (SynBase *)context;
  this->declaration = pEVar13;
  uVar1 = (ctx->definitions).count;
  if (uVar1 == (ctx->definitions).max) {
    SmallArray<ExprBase_*,_128U>::grow(&ctx->definitions,uVar1);
  }
  ppEVar3 = (ctx->definitions).data;
  if (ppEVar3 == (ExprBase **)0x0) {
    pcVar17 = "void SmallArray<ExprBase *, 128>::push_back(const T &) [T = ExprBase *, N = 128]";
  }
  else {
    pEVar13 = this->declaration;
    uVar1 = (ctx->definitions).count;
    (ctx->definitions).count = uVar1 + 1;
    ppEVar3[uVar1] = pEVar13;
    IntrusiveList<ExprBase>::push_back(&classDefinition->functions,this->declaration);
    uVar1 = (classType->methods).count;
    if (uVar1 == (classType->methods).max) {
      SmallArray<FunctionData_*,_4U>::grow(&classType->methods,uVar1);
    }
    ppFVar4 = (classType->methods).data;
    if (ppFVar4 != (FunctionData **)0x0) {
      uVar1 = (classType->methods).count;
      (classType->methods).count = uVar1 + 1;
      ppFVar4[uVar1] = this;
      SmallArray<ArgumentData,_32U>::~SmallArray(&local_648);
      return;
    }
    pcVar17 = "void SmallArray<FunctionData *, 4>::push_back(const T &) [T = FunctionData *, N = 4]"
    ;
  }
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,pcVar17);
}

Assistant:

void CreateDefaultClassConstructor(ExpressionContext &ctx, SynBase *source, ExprClassDefinition *classDefinition)
{
	TypeClass *classType = classDefinition->classType;

	// Check if custom default assignment operator is required
	bool customConstructor = false;

	if(classType->extendable)
	{
		customConstructor = true;
	}
	else
	{
		for(MemberHandle *el = classType->members.head; el; el = el->next)
		{
			TypeBase *base = el->variable->type;

			// Find array element type
			while(TypeArray *arrType = getType<TypeArray>(base))
				base = arrType->subType;

			if(el->initializer)
			{
				customConstructor = true;
				break;
			}

			if(HasDefaultConstructor(ctx, source, base))
			{
				customConstructor = true;
				break;
			}
		}
	}

	if(customConstructor)
	{
		bool addedParentScope = RestoreParentTypeScope(ctx, source, classType);

		InplaceStr functionName = GetFunctionNameInScope(ctx, ctx.scope, classType, GetTypeDefaultConstructorName(ctx, classType), false, false);

		SmallArray<ArgumentData, 32> arguments(ctx.allocator);

		SynIdentifier *functionNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(functionName);

		FunctionData *function = new (ctx.get<FunctionData>()) FunctionData(ctx.allocator, source, ctx.scope, false, false, false, ctx.GetFunctionType(source, ctx.typeVoid, arguments), ctx.GetReferenceType(classType), functionNameIdentifier, IntrusiveList<MatchData>(), ctx.uniqueFunctionId++);

		CheckFunctionConflict(ctx, source, function->name->name);

		ctx.AddFunction(function);

		ctx.PushScope(function);

		function->functionScope = ctx.scope;

		ExprVariableDefinition *contextArgumentDefinition = CreateFunctionContextArgument(ctx, ctx.MakeInternal(source), function);

		function->argumentsSize = function->functionScope->dataSize;

		IntrusiveList<ExprBase> expressions;

		CreateDefaultConstructorCode(ctx, source, classType, expressions);

		expressions.push_back(new (ctx.get<ExprReturn>()) ExprReturn(source, ctx.typeVoid, new (ctx.get<ExprVoid>()) ExprVoid(source, ctx.typeVoid), NULL, CreateFunctionUpvalueClose(ctx, ctx.MakeInternal(source), function, ctx.scope)));

		ClosePendingUpvalues(ctx, function);

		ctx.PopScope(SCOPE_FUNCTION);

		if(addedParentScope)
			ctx.PopScope(SCOPE_TYPE);

		VariableData *contextVariable = CreateFunctionContextVariable(ctx, source, function, NULL);
		ExprVariableDefinition *contextVariableDefinition = CreateFunctionContextVariableDefinition(ctx, source, function, NULL, contextVariable);

		function->declaration = new (ctx.get<ExprFunctionDefinition>()) ExprFunctionDefinition(source, function->type, function, contextArgumentDefinition, IntrusiveList<ExprVariableDefinition>(), NULL, expressions, contextVariableDefinition, contextVariable);

		ctx.definitions.push_back(function->declaration);

		classDefinition->functions.push_back(function->declaration);

		classType->methods.push_back(function);
	}
}